

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::setOutputStreams(QPDF *this,ostream *out,ostream *err)

{
  pointer this_00;
  element_type *this_01;
  shared_ptr<QPDFLogger> local_30;
  ostream *local_20;
  ostream *err_local;
  ostream *out_local;
  QPDF *this_local;
  
  local_20 = err;
  err_local = out;
  out_local = (ostream *)this;
  QPDFLogger::create();
  setLogger(this,&local_30);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_30);
  this_00 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                      (&this->m);
  this_01 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this_00);
  QPDFLogger::setOutputStreams(this_01,err_local,local_20);
  return;
}

Assistant:

void
QPDF::setOutputStreams(std::ostream* out, std::ostream* err)
{
    setLogger(QPDFLogger::create());
    m->log->setOutputStreams(out, err);
}